

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O1

void __thiscall
GetOpt::GetOpt_pp::_parse
          (GetOpt_pp *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *value;
  char cVar1;
  pointer pbVar2;
  char *pcVar3;
  Result RVar4;
  Token *pTVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  float aFloat;
  int anInt;
  stringstream dummy;
  key_type local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c8;
  float local_1c0;
  int local_1bc;
  string local_1b8 [4];
  ios_base local_138 [264];
  
  uVar8 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  bVar12 = (this->_app_name)._M_string_length == 0;
  local_1c8 = args;
  if (bVar12) {
    std::__cxx11::string::_M_assign((string *)&this->_app_name);
  }
  uVar11 = (ulong)bVar12;
  if (uVar11 < uVar8) {
    iVar9 = 0;
    do {
      pbVar2 = (local_1c8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      value = pbVar2 + uVar11;
      pcVar3 = pbVar2[uVar11]._M_dataplus._M_p;
      cVar1 = *pcVar3;
      if (cVar1 == '@') {
        if (value->_M_string_length < 2) goto LAB_0010a4b9;
        std::__cxx11::string::substr((ulong)local_1b8,(ulong)value);
        _parse_sub_file(this,local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
          operator_delete(local_1b8[0]._M_dataplus._M_p);
        }
      }
      else if ((cVar1 == '-') && (1 < value->_M_string_length)) {
        if (pcVar3[1] == '-') {
          if (value->_M_string_length == 2) {
            pTVar5 = _add_token(this,value,GlobalArgument);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
                     ::operator[](&this->_longOps,value);
            pmVar6->token = pTVar5;
          }
          else {
            std::__cxx11::string::substr((ulong)local_1b8,(ulong)value);
            pTVar5 = _add_token(this,local_1b8,LongOption);
            std::__cxx11::string::substr((ulong)&local_1e8,(ulong)value);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
                     ::operator[](&this->_longOps,&local_1e8);
            pmVar6->token = pTVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
              operator_delete(local_1b8[0]._M_dataplus._M_p);
            }
          }
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          RVar4 = convert<int>(value,&local_1bc,
                               *(fmtflags *)
                                ((long)&local_1b8[0].field_2 +
                                *(long *)(local_1b8[0]._M_dataplus._M_p + -0x18) + 8));
          if (RVar4 == OK) {
            if (2 < value->_M_string_length) goto LAB_0010a61a;
            pTVar5 = _add_token(this,value,PossibleNegativeArgument);
            pmVar7 = std::
                     map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
                     ::operator[](&this->_shortOps,(value->_M_dataplus)._M_p + 1);
            pmVar7->token = pTVar5;
          }
          else {
            RVar4 = convert<float>(value,&local_1c0,
                                   *(fmtflags *)
                                    ((long)&local_1b8[0].field_2 +
                                    *(long *)(local_1b8[0]._M_dataplus._M_p + -0x18) + 8));
            if (RVar4 == OK) {
LAB_0010a61a:
              _add_token(this,value,iVar9 * 4 + GlobalArgument);
            }
            else if (1 < value->_M_string_length) {
              uVar10 = 1;
              do {
                std::__cxx11::string::string((string *)&local_1e8,(string *)value,uVar10,1);
                pTVar5 = _add_token(this,&local_1e8,ShortOption);
                pmVar7 = std::
                         map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
                         ::operator[](&this->_shortOps,(value->_M_dataplus)._M_p + uVar10);
                pmVar7->token = pTVar5;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 < value->_M_string_length);
            }
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        iVar9 = 1;
      }
      else {
LAB_0010a4b9:
        _add_token(this,value,iVar9 * 4 + GlobalArgument);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar8);
  }
  this->_last = OK;
  return;
}

Assistant:

GETOPT_INLINE void GetOpt_pp::_parse(const std::vector<std::string>& args)
{
    bool any_option_processed = false;
    const size_t argc = args.size();

    size_t start = 0;
    if ( _app_name.empty() )
    {
        _app_name = args[0];
        start = 1;
    }

    // parse arguments by their '-' or '--':
    //   (this will be a state machine soon)
    for (size_t i = start; i < argc; i++)
    {
        const std::string& currentArg = args[i];

        if (currentArg[0] == '-' && currentArg.size() > 1)
        {
            // see what's next, differentiate whether it's short or long:
            if (currentArg[1] == '-')
            {
                if ( currentArg.size() > 2 )
                {
                    // long option
                    _longOps[currentArg.substr(2)].token = _add_token(currentArg.substr(2), Token::LongOption);
                }
                else
                {
                    // it's the -- option alone
                    _longOps[currentArg].token = _add_token(currentArg, Token::GlobalArgument);
                }

                any_option_processed = true;
            }
            else
            {
                // check if it is a negative number: rules
                //  * floating point negative numbers are straight classified as 'arguments'
                //  * integer negative numbers of more than 1 digit length are also 'arguments'
                //  * integer negatives of 1 digit length can be either arguments or short options.
                //  * anything else: short options.
                int anInt;
                float aFloat;
                std::stringstream dummy;
                if ( convert(currentArg, anInt, dummy.flags()) == _Option::OK )
                {
                    if ( currentArg.size() > 2 ) // if it's larger than -d (d=digit), then assume it's a negative number:
                        _add_token(currentArg, any_option_processed ? Token::UnknownYet : Token::GlobalArgument);
                    else // size == 2: it's a 1 digit negative number
                        _shortOps[currentArg[1]].token = _add_token(currentArg, Token::PossibleNegativeArgument);
                }
                else if ( convert(currentArg, aFloat, dummy.flags()) == _Option::OK )
                    _add_token(currentArg, any_option_processed ? Token::UnknownYet : Token::GlobalArgument);
                else
                {
                    // short option
                    // iterate over all of them, keeping the last one in currentData
                    // (so the intermediates will generate 'existent' arguments, as of '-abc')
                    for( size_t j = 1; j < currentArg.size(); j++ )
                        _shortOps[currentArg[j]].token = _add_token(std::string(currentArg, j, 1), Token::ShortOption);
                }

                any_option_processed = true;
            }
        }
        else if ( currentArg[0] == '@' && currentArg.size() > 1 )
        {
            // suboptions file
            _parse_sub_file(currentArg.substr(1));
        }
        else
        {
            _add_token(currentArg, any_option_processed ? Token::UnknownYet : Token::GlobalArgument);
        }
    }

    _last = _Option::OK;    // TODO: IMPROVE!!
}